

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
vkt::shaderexecutor::FloatFunc2::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc2 *this,EvalContext *ctx,Interval *xi,
          Interval *yi)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  char cVar6;
  Interval *ret_arg_;
  double dVar7;
  double dVar8;
  ScopedRoundingMode point_ctx_;
  Interval local_f0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  Interval local_b0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  Interval *local_68;
  Interval local_60;
  Interval local_48;
  
  uVar5 = 0;
  local_48.m_hasNaN = false;
  dVar7 = INFINITY;
  dVar8 = -INFINITY;
  local_48.m_lo = INFINITY;
  local_48.m_hi = -INFINITY;
  local_b0.m_hasNaN = false;
  local_b0.m_lo = INFINITY;
  local_b0.m_hi = -INFINITY;
  local_60.m_hasNaN = false;
  local_60.m_lo = INFINITY;
  local_60.m_hi = -INFINITY;
  dVar1 = xi->m_lo;
  if (dVar1 < xi->m_hi || dVar1 == xi->m_hi) {
    dVar7 = yi->m_lo;
    local_68 = __return_storage_ptr__;
    if (dVar7 < yi->m_hi || dVar7 == yi->m_hi) {
      local_d8 = dVar7;
      local_c8 = dVar1;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      bVar2 = local_f0.m_hasNaN;
      local_78 = local_f0.m_lo;
      dStack_70 = local_f0.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      bVar3 = local_f0.m_hasNaN;
      local_88 = local_f0.m_lo;
      dStack_80 = local_f0.m_hi;
      tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_d8 = yi->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      uVar4 = local_f0._0_4_;
      local_98 = local_f0.m_lo;
      dStack_90 = local_f0.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      local_c8 = (double)(~-(ulong)(local_78 <= local_88) & (ulong)local_88 |
                         (ulong)local_78 & -(ulong)(local_78 <= local_88));
      dStack_c0 = (double)(~-(ulong)(dStack_80 <= dStack_70) & (ulong)dStack_80 |
                          (ulong)dStack_70 & -(ulong)(dStack_80 <= dStack_70));
      cVar6 = '\x01';
      if ((uVar4 & 1) == 0) {
        cVar6 = local_f0.m_hasNaN;
      }
      if (((bVar2 | bVar3) & 1U) != 0) {
        cVar6 = '\x01';
      }
      local_d8 = (double)(~-(ulong)(local_98 <= local_f0.m_lo) & (ulong)local_f0.m_lo |
                         (ulong)local_98 & -(ulong)(local_98 <= local_f0.m_lo));
      dStack_d0 = (double)(~-(ulong)(local_f0.m_hi <= dStack_90) & (ulong)local_f0.m_hi |
                          (ulong)dStack_90 & -(ulong)(local_f0.m_hi <= dStack_90));
      tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_b0.m_lo =
           (double)(~-(ulong)(local_c8 <= local_d8) & (ulong)local_d8 |
                   (ulong)local_c8 & -(ulong)(local_c8 <= local_d8));
      local_b0.m_hi =
           (double)(~-(ulong)(dStack_d0 <= dStack_c0) & (ulong)dStack_d0 |
                   (ulong)dStack_c0 & -(ulong)(dStack_d0 <= dStack_c0));
    }
    else {
      local_b0.m_lo = INFINITY;
      local_b0.m_hi = -INFINITY;
      cVar6 = '\0';
    }
    local_b0.m_hasNaN = (bool)cVar6;
    if (yi->m_hasNaN == true) {
      local_f0.m_hasNaN = true;
      local_f0.m_lo = INFINITY;
      local_f0.m_hi = -INFINITY;
      tcu::Interval::operator|=(&local_b0,&local_f0);
    }
    dVar1 = yi->m_lo;
    if (dVar1 < yi->m_hi || dVar1 == yi->m_hi) {
      local_c8 = xi->m_hi;
      local_d8 = dVar1;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      bVar2 = local_f0.m_hasNaN;
      local_78 = local_f0.m_lo;
      dStack_70 = local_f0.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      bVar3 = local_f0.m_hasNaN;
      local_88 = local_f0.m_lo;
      dStack_80 = local_f0.m_hi;
      tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_d8 = yi->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      uVar4 = local_f0._0_4_;
      local_98 = local_f0.m_lo;
      dStack_90 = local_f0.m_hi;
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      (*(this->
        super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        ).
        super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
        .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_d8,&local_f0,this,ctx);
      local_c8 = (double)(~-(ulong)(local_78 <= local_88) & (ulong)local_88 |
                         (ulong)local_78 & -(ulong)(local_78 <= local_88));
      dStack_c0 = (double)(~-(ulong)(dStack_80 <= dStack_70) & (ulong)dStack_80 |
                          (ulong)dStack_70 & -(ulong)(dStack_80 <= dStack_70));
      uVar5 = 1;
      if ((uVar4 & 1) == 0) {
        uVar5 = local_f0.m_hasNaN;
      }
      if (((bVar2 | bVar3) & 1U) != 0) {
        uVar5 = 1;
      }
      local_d8 = (double)(~-(ulong)(local_98 <= local_f0.m_lo) & (ulong)local_f0.m_lo |
                         (ulong)local_98 & -(ulong)(local_98 <= local_f0.m_lo));
      dStack_d0 = (double)(~-(ulong)(local_f0.m_hi <= dStack_90) & (ulong)local_f0.m_hi |
                          (ulong)dStack_90 & -(ulong)(local_f0.m_hi <= dStack_90));
      tcu::ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_60.m_lo =
           (double)(~-(ulong)(local_c8 <= local_d8) & (ulong)local_d8 |
                   (ulong)local_c8 & -(ulong)(local_c8 <= local_d8));
      local_60.m_hi =
           (double)(~-(ulong)(dStack_d0 <= dStack_c0) & (ulong)dStack_d0 |
                   (ulong)dStack_c0 & -(ulong)(dStack_d0 <= dStack_c0));
    }
    else {
      local_60.m_lo = INFINITY;
      local_60.m_hi = -INFINITY;
      uVar5 = 0;
    }
    local_60.m_hasNaN = (bool)uVar5;
    if (yi->m_hasNaN == true) {
      local_f0.m_hasNaN = true;
      local_f0.m_lo = INFINITY;
      local_f0.m_hi = -INFINITY;
      tcu::Interval::operator|=(&local_60,&local_f0);
    }
    uVar5 = 1;
    if (local_b0.m_hasNaN == false) {
      uVar5 = local_60.m_hasNaN;
    }
    dVar7 = (double)(~-(ulong)(local_b0.m_lo <= local_60.m_lo) & (ulong)local_60.m_lo |
                    (ulong)local_b0.m_lo & -(ulong)(local_b0.m_lo <= local_60.m_lo));
    dVar8 = (double)(~-(ulong)(local_60.m_hi <= local_b0.m_hi) & (ulong)local_60.m_hi |
                    (ulong)local_b0.m_hi & -(ulong)(local_60.m_hi <= local_b0.m_hi));
    __return_storage_ptr__ = local_68;
  }
  local_48.m_hasNaN = (bool)uVar5;
  local_48.m_lo = dVar7;
  local_48.m_hi = dVar8;
  if (xi->m_hasNaN == true) {
    local_f0.m_hasNaN = true;
    local_f0.m_lo = INFINITY;
    local_f0.m_hi = -INFINITY;
    tcu::Interval::operator|=(&local_48,&local_f0);
  }
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(&local_b0,this,ctx,xi,yi);
  tcu::Interval::operator|=(&local_48,&local_b0);
  (*(this->
    super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).
    super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(&local_60,this);
  local_b0.m_hasNaN = true;
  local_b0.m_lo =
       (double)(~-(ulong)(local_60.m_lo <= INFINITY) & 0x7ff0000000000000 |
               (ulong)local_60.m_lo & -(ulong)(local_60.m_lo <= INFINITY));
  local_b0.m_hi =
       (double)(~-(ulong)(-INFINITY <= local_60.m_hi) & 0xfff0000000000000 |
               (ulong)local_60.m_hi & -(ulong)(-INFINITY <= local_60.m_hi));
  tcu::Interval::operator&=(&local_48,&local_b0);
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_48);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext&	ctx,
										 const Interval&	xi,
										 const Interval&	yi) const
	{
		Interval reti;

		TCU_INTERVAL_APPLY_MONOTONE2(reti, x, xi, y, yi, ret,
									 TCU_SET_INTERVAL(ret, point,
													  point = this->applyPoint(ctx, x, y)));
		reti |= innerExtrema(ctx, xi, yi);
		reti &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(reti);
	}